

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O0

void __thiscall SkeletalMesh::Scene::clear(Scene *this)

{
  string local_50 [32];
  string local_30 [32];
  Scene *local_10;
  Scene *this_local;
  
  this->available = false;
  local_10 = this;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::operator=((string *)&this->name,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::operator=((string *)&this->filename,local_50);
  std::__cxx11::string::~string(local_50);
  this->scene = (aiScene *)0x0;
  (*__glewDeleteVertexArrays)(1,&this->vao);
  this->vao = 0;
  (*__glewDeleteBuffers)(1,&this->vbo);
  this->vbo = 0;
  (*__glewDeleteBuffers)(1,&this->ebo);
  this->ebo = 0;
  std::vector<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>::clear
            (&this->meshEntry);
  std::vector<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>::clear
            (&this->material);
  std::vector<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>::clear(&this->skeleton);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::clear(&this->nameBoneMap);
  return;
}

Assistant:

void clear() {
            available = false;
            name = std::string();
            filename = std::string();
            // importer..
            scene = NULL;
            glDeleteVertexArrays(1, &vao);
            vao = 0;
            glDeleteBuffers(1, &vbo);
            vbo = 0;
            glDeleteBuffers(1, &ebo);
            ebo = 0;
            meshEntry.clear();
            material.clear();
            skeleton.clear();
            nameBoneMap.clear();
        }